

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O2

string * StringBuilder<char,char_const(&)[2],char_const&,char_const(&)[2],std::__cxx11::string_const&>
                   (string *__return_storage_ptr__,char *arg,char (*args) [2],char *args_1,
                   char (*args_2) [2],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3)

{
  string sStack_68;
  string local_48;
  
  StringBuilder_abi_cxx11_(&local_48,arg);
  StringBuilder<char[2],char_const&,char_const(&)[2],std::__cxx11::string_const&>
            (&sStack_68,args,args_1,args_2,args_3);
  std::operator+(__return_storage_ptr__,&local_48,&sStack_68);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}